

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O2

bool selected_objs_replace_placeholder_proc(Am_Object *ph,Am_Value *new_value,Am_Object *sel_widget)

{
  bool bVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  
  pAVar2 = Am_Object::Get(ph,Am_PLACEHOLDER_INITIALIZED,1);
  bVar1 = Am_Value::Valid(pAVar2);
  if (bVar1) {
    pAVar2 = Am_Object::Get(ph,0x169,0);
    Am_Value::operator=(new_value,pAVar2);
  }
  else {
    Am_Object::Set(ph,Am_PLACEHOLDER_INITIALIZED,true,0);
    pAVar2 = Am_Object::Get(sel_widget,0x169,0);
    Am_Value::operator=(new_value,pAVar2);
    if (am_sdebug == true) {
      poVar3 = std::operator<<((ostream *)&std::cout,"for placeholder ");
      poVar3 = operator<<(poVar3,ph);
      poVar3 = std::operator<<(poVar3," setting value to ");
      poVar3 = operator<<(poVar3,new_value);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::ostream::flush();
    }
    Am_Object::Set(ph,0x169,new_value,0);
  }
  return true;
}

Assistant:

Am_Define_Method(Am_Placeholder_Replace_Method, bool,
                 selected_objs_replace_placeholder,
                 (Am_Object & ph, Am_Value &new_value, Am_Object &sel_widget))
{
  if (ph.Peek(Am_PLACEHOLDER_INITIALIZED).Valid()) {
    new_value = ph.Get(Am_VALUE);
    return true;
  } else {
    ph.Set(Am_PLACEHOLDER_INITIALIZED, true);
    new_value = sel_widget.Get(Am_VALUE);
    if (am_sdebug)
      std::cout << "for placeholder " << ph << " setting value to " << new_value
                << std::endl
                << std::flush;
    ph.Set(Am_VALUE, new_value);
    return true;
  }
}